

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_definitions.hpp
# Opt level: O0

double units::detail::otherUsefulConversions<units::unit,units::unit>
                 (double val,unit *start,unit *result)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  unit_data uVar4;
  unit_data *extraout_RAX;
  unit *in_RSI;
  unit *in_RDI;
  double in_XMM0_Qa;
  double __x;
  double __x_00;
  double dVar5;
  double dVar6;
  double in_XMM1_Qa;
  unit *in_stack_00000058;
  unit *in_stack_00000060;
  double in_stack_00000068;
  unit *in_stack_ffffffffffffff68;
  unit *in_stack_ffffffffffffff70;
  unit *in_stack_ffffffffffffff78;
  unit *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  unit local_60;
  unit_data local_58;
  unit_data local_54;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  unit_data *in_stack_ffffffffffffffb8;
  unit_data *this;
  unit local_40;
  unit_data local_38;
  unit_data local_34;
  unit_data local_30;
  unit_data local_2c;
  unit_data local_28;
  unit_data local_24;
  unit *local_20;
  unit *local_18;
  double local_10;
  
  local_20 = in_RSI;
  local_18 = in_RDI;
  local_10 = in_XMM0_Qa;
  local_24 = unit::base_units(in_RDI);
  iVar2 = unit_data::kg(&local_24);
  local_28 = unit::base_units(local_20);
  iVar3 = unit_data::kg(&local_28);
  if (iVar2 == iVar3) {
    local_30 = unit::base_units(local_18);
    local_34 = unit::base_units(local_20);
    local_2c = unit_data::operator/
                         (in_stack_ffffffffffffffb8,
                          (unit_data *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
                         );
    unit::pow((unit *)&units::s,__x,in_XMM1_Qa);
    this = extraout_RAX;
    local_40 = unit::operator/((unit *)CONCAT44(iVar2,in_stack_ffffffffffffff88),
                               in_stack_ffffffffffffff80);
    local_38 = unit::base_units(&local_40);
    bVar1 = unit_data::has_same_base
                      ((unit_data *)in_stack_ffffffffffffff80,(unit_data *)in_stack_ffffffffffffff78
                      );
    if (bVar1) {
      dVar6 = unit::multiplier(local_18);
      dVar6 = (local_10 * dVar6) / 9.80665;
      dVar5 = unit::multiplier(local_20);
      return dVar6 / dVar5;
    }
    uVar4 = unit::base_units(local_20);
    local_54 = unit::base_units(local_18);
    unit_data::operator/(this,(unit_data *)CONCAT44(in_stack_ffffffffffffffb4,uVar4));
    unit::pow((unit *)&units::s,__x_00,in_XMM1_Qa);
    local_60 = unit::operator/((unit *)CONCAT44(iVar2,in_stack_ffffffffffffff88),
                               in_stack_ffffffffffffff80);
    local_58 = unit::base_units(&local_60);
    bVar1 = unit_data::has_same_base
                      ((unit_data *)in_stack_ffffffffffffff80,(unit_data *)in_stack_ffffffffffffff78
                      );
    if (bVar1) {
      dVar6 = unit::multiplier(local_18);
      dVar6 = local_10 * dVar6 * 9.80665;
      dVar5 = unit::multiplier(local_20);
      return dVar6 / dVar5;
    }
  }
  unit_cast(local_18);
  bVar1 = unit::operator==(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  if (bVar1) {
    bVar1 = unit::has_same_base(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    if (bVar1) {
      dVar6 = convert<units::unit,units::unit>
                        (in_stack_00000068,in_stack_00000060,in_stack_00000058);
      return dVar6;
    }
    bVar1 = unit::has_same_base(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    if (bVar1) {
      dVar6 = convert<units::unit,units::unit>
                        (in_stack_00000068,in_stack_00000060,in_stack_00000058);
      return dVar6;
    }
  }
  return NAN;
}

Assistant:

inline double
        otherUsefulConversions(double val, const UX& start, const UX2& result)
    {
        if (start.base_units().kg() == result.base_units().kg()) {
            if ((start.base_units() / result.base_units())
                    .has_same_base((m / s.pow(2)).base_units())) {
                // weight to mass
                return val * start.multiplier() / constants::standard_gravity /
                    result.multiplier();
            }
            if ((result.base_units() / start.base_units())
                    .has_same_base((m / s.pow(2)).base_units())) {
                // mass to weight
                return val * start.multiplier() * constants::standard_gravity /
                    result.multiplier();
            }
        }
        if (unit_cast(start) == kilo) {
            if (result.has_same_base(kg)) {
                return convert(val, kg, result);
            }
            if (result.has_same_base(m)) {
                return convert(val, km, result);
            }
        }
        return constants::invalid_conversion;
    }